

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O1

void __thiscall
SuiteMessageTests::TestgetFieldIfPresent::~TestgetFieldIfPresent(TestgetFieldIfPresent *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(getFieldIfPresent)
{
  FIX::Message message;
  FIX::MsgType initial("A");
  CHECK( !message.getFieldIfSet( initial ) );
  CHECK( initial == FIX::MsgType("A") );

  message.setField( initial );
  FIX::MsgType stored;
  CHECK( message.getFieldIfSet( stored ) );
  CHECK( stored == initial );
}